

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O1

int Cec3_ManSweepNode(Cec3_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  Gia_Rpr_t *pGVar2;
  long *plVar3;
  Gia_Man_t *pGVar4;
  word *pwVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  Gia_Obj_t *pGVar16;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (-1 < iObj) {
    pGVar4 = p->pAig;
    if (iObj < pGVar4->nObjs) {
      uVar12 = (ulong)(uint)pGVar4->pReprs[(uint)iObj] & 0xfffffff;
      if (uVar12 == 0xfffffff) {
        pGVar16 = (Gia_Obj_t *)0x0;
      }
      else {
        if (pGVar4->nObjs <= (int)uVar12) goto LAB_00653313;
        pGVar16 = pGVar4->pObjs + uVar12;
      }
      pGVar1 = pGVar4->pObjs + (uint)iObj;
      uVar8 = pGVar1->Value;
      if (-1 < (int)uVar8) {
        uVar14 = pGVar16->Value;
        local_38 = lVar11;
        if (-1 < (int)uVar14) {
          uVar13 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x3f) ^ (uVar14 ^ uVar8) & 1;
          uVar10 = -(int)((long)*(undefined8 *)pGVar16 >> 0x3f);
          iVar6 = Cec3_ManSolveTwo(p,uVar14 >> 1,uVar8 >> 1,uVar13 ^ uVar10);
          if (iVar6 == -1) {
            p->nSatUnsat = p->nSatUnsat + 1;
            if ((int)pGVar16->Value < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            pGVar1->Value = pGVar16->Value ^ (uint)(uVar13 != uVar10);
            pGVar2 = p->pAig->pReprs + (uint)iObj;
            *pGVar2 = (Gia_Rpr_t)((uint)*pGVar2 | 0x10000000);
            iVar6 = clock_gettime(3,&local_48);
            if (iVar6 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar6 = 1;
            lVar15 = 0x70;
          }
          else if (iVar6 == 1) {
            p->nSatSat = p->nSatSat + 1;
            p->nPatterns = p->nPatterns + 1;
            pGVar4 = p->pAig;
            iVar7 = pGVar4->nSimWords * 0x40;
            iVar6 = 1;
            if (pGVar4->iPatsPi != iVar7 + -1) {
              iVar6 = pGVar4->iPatsPi + 1;
            }
            pGVar4->iPatsPi = iVar6;
            if ((iVar6 < 1) || (iVar7 <= iVar6)) {
              __assert_fail("p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                            ,0x36a,"int Cec3_ManSweepNode(Cec3_Man_t *, int)");
            }
            pVVar9 = p->vObjSatPairs;
            if (1 < pVVar9->nSize) {
              lVar11 = 1;
              do {
                iVar6 = pVVar9->pArray[lVar11 + -1];
                pGVar4 = p->pAig;
                uVar8 = bmcg_sat_solver_read_cex_varvalue(p->pSat,pVVar9->pArray[lVar11]);
                uVar14 = iVar6 * pGVar4->nSimWords;
                if (((int)uVar14 < 0) || (pGVar4->vSims->nSize <= (int)uVar14)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                pwVar5 = pGVar4->vSims->pArray;
                lVar15 = (long)(pGVar4->iPatsPi >> 5);
                uVar13 = *(uint *)((long)pwVar5 + lVar15 * 4 + (ulong)uVar14 * 8);
                uVar10 = pGVar4->iPatsPi & 0x1f;
                if (((uVar13 >> uVar10 & 1) != 0) != uVar8) {
                  *(uint *)((long)pwVar5 + lVar15 * 4 + (ulong)uVar14 * 8) = uVar13 ^ 1 << uVar10;
                }
                pVVar9 = p->vObjSatPairs;
                lVar11 = lVar11 + 2;
              } while ((int)lVar11 < pVVar9->nSize);
            }
            iVar6 = clock_gettime(3,&local_48);
            if (iVar6 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar6 = 0;
            lVar15 = 0x68;
          }
          else {
            p->nSatUndec = p->nSatUndec + 1;
            if (iVar6 != 0) {
              __assert_fail("status == GLUCOSE_UNDEC",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                            ,0x37c,"int Cec3_ManSweepNode(Cec3_Man_t *, int)");
            }
            pGVar2 = p->pAig->pReprs + (uint)iObj;
            *pGVar2 = (Gia_Rpr_t)((uint)*pGVar2 | 0x20000000);
            iVar6 = clock_gettime(3,&local_48);
            if (iVar6 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar6 = 2;
            lVar15 = 0x78;
          }
          plVar3 = (long *)((long)&p->pPars + lVar15);
          *plVar3 = *plVar3 + lVar11 + local_38;
          if (p->pPars->fUseCones == 0) {
            iVar7 = clock_gettime(3,&local_48);
            if (iVar7 < 0) {
              lVar11 = 1;
            }
            else {
              lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
              lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_48.tv_sec * -1000000;
            }
            bmcg_sat_solver_reset(p->pSat);
            iVar7 = clock_gettime(3,&local_48);
            if (iVar7 < 0) {
              lVar15 = -1;
            }
            else {
              lVar15 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            p->timeExtra = p->timeExtra + lVar15 + lVar11;
          }
          return iVar6;
        }
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
  }
LAB_00653313:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Cec3_ManSweepNode( Cec3_Man_t * p, int iObj )
{
    abctime clk = Abc_Clock();
    int i, IdAig, IdSat, status, RetValue = 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pAig, iObj );
    Gia_Obj_t * pRepr = Gia_ObjReprObj( p->pAig, iObj );
    int fCompl = Abc_LitIsCompl(pObj->Value) ^ Abc_LitIsCompl(pRepr->Value) ^ pObj->fPhase ^ pRepr->fPhase;
    status = Cec3_ManSolveTwo( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
    if ( status == GLUCOSE_SAT )
    {
        p->nSatSat++;
        p->nPatterns++;
        p->pAig->iPatsPi = (p->pAig->iPatsPi == 64 * p->pAig->nSimWords - 1) ? 1 : p->pAig->iPatsPi + 1;
        assert( p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords );
        Vec_IntForEachEntryDouble( p->vObjSatPairs, IdAig, IdSat, i )
//            Cec3_ObjSimSetInputBit( p->pAig, IdAig, satoko_var_polarity(p->pSat, IdSat) == SATOKO_LIT_TRUE );
            Cec3_ObjSimSetInputBit( p->pAig, IdAig, bmcg_sat_solver_read_cex_varvalue(p->pSat, IdSat) );
        p->timeSatSat += Abc_Clock() - clk;
        RetValue = 0;
    }
    else if ( status == GLUCOSE_UNSAT )
    {
        p->nSatUnsat++;
        pObj->Value = Abc_LitNotCond( pRepr->Value, fCompl );
        Gia_ObjSetProved( p->pAig, iObj );
        p->timeSatUnsat += Abc_Clock() - clk;
        RetValue = 1;
    }
    else 
    {
        p->nSatUndec++;
        assert( status == GLUCOSE_UNDEC );
        Gia_ObjSetFailed( p->pAig, iObj );
        p->timeSatUndec += Abc_Clock() - clk;
        RetValue = 2;
    }
    if ( p->pPars->fUseCones )
        return RetValue;
    clk = Abc_Clock();
    bmcg_sat_solver_reset( p->pSat );
    p->timeExtra += Abc_Clock() - clk;
//    satoko_stats(p->pSat)->n_conflicts = 0;
    return RetValue;
}